

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint16_t uVar1;
  int iVar2;
  uint len;
  __sighandler_t p_Var3;
  undefined8 *__buf;
  char *__s;
  long lVar4;
  void *buf;
  pthread_t *__newthread;
  ulong uVar5;
  uint16_t devn;
  uint16_t busn;
  in_addr remote_host;
  uintptr_t addr;
  nettlp nt;
  psmem psmem;
  nettlp_cb cb;
  psmem_thread pth [16];
  ushort local_3bc;
  short local_3ba;
  uint local_3b8;
  in_addr local_3b4;
  uintptr_t local_3b0;
  undefined1 local_3a8 [8];
  pthread_t pStack_3a0;
  pthread_t local_398;
  uintptr_t local_390 [2];
  void *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  code *local_368;
  code *pcStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  pthread_t local_338 [97];
  
  local_3a8 = (undefined1  [8])0x0;
  pStack_3a0 = 0;
  local_398 = 0;
  local_3b0 = 0;
  local_3ba = 0;
  local_3bc = 0;
  local_3b8 = 0;
  len = 0;
LAB_00102ae3:
  do {
    while (iVar2 = getopt(argc,argv,"r:l:b:R:a:m:HSn:s:"), iVar2 < 0x61) {
      if (iVar2 < 0x52) {
        if (iVar2 != 0x48) {
          if (iVar2 != -1) goto switchD_00102b21_caseD_6f;
          local_390[0] = local_3b0;
          local_380 = malloc(0x10000000);
          local_390[1] = 0x10000000;
          local_378 = 0;
          uStack_370 = 0;
          local_358 = 0;
          uStack_350 = 0;
          local_348 = 0;
          local_368 = psmem_mrd;
          pcStack_360 = psmem_mwr;
          if (0x3b < (int)len && 0 < (int)local_3b8) {
            if (0x800 < (int)len) {
              main_cold_3();
              return -1;
            }
            if (nostdout == '\0') {
              fprintf(_stdout,"%s: initalize the region with %d %d-byte packets\n","main",
                      (ulong)local_3b8,(ulong)len);
            }
            uVar5 = (ulong)len;
            buf = local_380;
            do {
              build_pkt(buf,len,0);
              buf = (void *)((long)buf + 0x800);
              uVar5 = uVar5 - 1;
            } while (uVar5 != 0);
          }
          lVar4 = 0;
          printf("start psmem callbacks. BAR4 is %#lx, Dev is 0x%x\n",local_3b0,pStack_3a0 & 0xffff)
          ;
          __newthread = local_338;
          do {
            __newthread[4] = (pthread_t)local_390;
            __newthread[5] = (pthread_t)&local_378;
            __newthread[1] = (pthread_t)local_3a8;
            __newthread[2] = pStack_3a0;
            __newthread[3] = local_398;
            *(char *)((long)__newthread + 0x12) = (char)lVar4;
            *(undefined4 *)((long)__newthread + 0x14) = 1;
            iVar2 = nettlp_init((nettlp *)(__newthread + 1));
            if (iVar2 < 0) {
              main_cold_2();
              return iVar2;
            }
            iVar2 = pthread_create(__newthread,(pthread_attr_t *)0x0,nettlp_cb_thread,__newthread);
            if (iVar2 < 0) {
              main_cold_1();
              return iVar2;
            }
            usleep(0x14);
            lVar4 = lVar4 + 1;
            __newthread = __newthread + 6;
          } while (lVar4 != 0x10);
          p_Var3 = signal(2,sig_handler);
          if (p_Var3 != (__sighandler_t)0xffffffffffffffff) {
            lVar4 = 0;
            do {
              pthread_join(*(pthread_t *)((long)local_338 + lVar4),(void **)0x0);
              lVar4 = lVar4 + 0x30;
            } while (lVar4 != 0x300);
            return 0;
          }
          __s = "cannot set signal\n";
          goto LAB_00102e22;
        }
        nohex = 1;
      }
      else if (iVar2 == 0x52) {
        iVar2 = inet_pton(2,_optarg,&local_3b4);
        if (iVar2 < 1) goto LAB_00102df1;
        local_3b0 = nettlp_msg_get_bar4_start(local_3b4);
        if (local_3b0 == 0) {
          __s = "nettlp_msg_get_bar4_start";
          goto LAB_00102e22;
        }
        uVar1 = nettlp_msg_get_dev_id(local_3b4);
        pStack_3a0 = CONCAT62(pStack_3a0._2_6_,uVar1);
      }
      else {
        if (iVar2 != 0x53) goto switchD_00102b21_caseD_6f;
        nostdout = '\x01';
      }
    }
    switch(iVar2) {
    case 0x6c:
      __buf = (undefined8 *)((long)local_3a8 + 4);
      break;
    case 0x6d:
      mrd_sleep = atoi(_optarg);
      goto LAB_00102ae3;
    case 0x6e:
      local_3b8 = atoi(_optarg);
      goto LAB_00102ae3;
    case 0x6f:
    case 0x70:
    case 0x71:
      goto switchD_00102b21_caseD_6f;
    case 0x72:
      __buf = (undefined8 *)local_3a8;
      break;
    case 0x73:
      len = atoi(_optarg);
      goto LAB_00102ae3;
    default:
      if (iVar2 == 0x61) {
        __isoc99_sscanf(_optarg,"0x%lx",&local_3b0);
      }
      else {
        if (iVar2 != 0x62) {
switchD_00102b21_caseD_6f:
          puts(
              "usage\n    -r remote addr at NetTLP link\n    -l local addr at NetTLP link\n\n    -R remote host addr to get BAR4 start address\n    or\n    -a start addess (HEX)\n    -b bus number, XX:XX\n\n  initialize with packets options\n    -n nuber of packets\n    -s packet size\n\n  testing options\n    -m sleep on mrd (usec)\n\n  output options\n    -H no hexdump\n    -S no stdout"
              );
          return -1;
        }
        __isoc99_sscanf(_optarg,"%hx:%hx",&local_3ba,&local_3bc);
        pStack_3a0 = CONCAT62(pStack_3a0._2_6_,local_3ba << 8 | local_3bc);
      }
      goto LAB_00102ae3;
    }
    iVar2 = inet_pton(2,_optarg,__buf);
    if (iVar2 < 1) {
LAB_00102df1:
      __s = "inet_pton";
LAB_00102e22:
      perror(__s);
      return -1;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{

#define NTHREADS	16	/* adapter v0.15.1 uses tag & 0xF for ports */

	int ret, ch, n;
	struct in_addr remote_host;
	struct psmem psmem;
	struct nettlp nt;	/* the original nettlp */
	struct nettlp_cb cb;
	struct psmem_thread pth[NTHREADS];
	uintptr_t addr;
	uint16_t busn, devn;
	int pktnum, pktlen;

	memset(&nt, 0, sizeof(nt));
	addr = 0;
	busn = 0;
	devn = 0;

	pktnum = 0;
	pktlen = 0;

	while ((ch = getopt(argc, argv, "r:l:b:R:a:m:HSn:s:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 'R':
			ret = inet_pton(AF_INET, optarg, &remote_host);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}

			addr = nettlp_msg_get_bar4_start(remote_host);
			if (addr == 0) {
				perror("nettlp_msg_get_bar4_start");
				return -1;
			}

			nt.requester = nettlp_msg_get_dev_id(remote_host);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 'm':
			mrd_sleep = atoi(optarg);
			break;

		case 'H':
			nohex = 1;
			break;

		case 'S':
			nostdout = 1;
			break;

		case 'n':
			pktnum = atoi(optarg);
			break;

		case 's':
			pktlen = atoi(optarg);
			break;

		default :
			usage();
			return -1;
		}
	}

	/* initalize psmem area and callback */
	psmem.addr = addr;
	psmem.mem = malloc(1024 * 1024 * 256);	/* 256MB */
	psmem.size = 1024 * 1024 * 256;

	memset(&cb, 0, sizeof(cb));
	cb.mrd = psmem_mrd;
	cb.mwr = psmem_mwr;

	if (pktnum > 0 && pktlen >= 60) {
		if (pktlen > 2048) {
			pr_err("too large packet size. must be <= 2048\n");
			return -1;
		}

		pr_info("initalize the region with %d %d-byte packets\n",
			pktnum, pktlen);
		initialize_with_packets(psmem.mem, pktlen, pktnum);
	}

	printf("start psmem callbacks. BAR4 is %#lx, Dev is 0x%x\n",
	       addr, nt.requester);

	/* initalize and start threads on each port 0x3000 + 0x0 ~ 0xF */
	for (n = 0; n < NTHREADS; n++) {
		pth[n].psmem = &psmem;
		pth[n].cb = &cb;
		pth[n].nt = nt;
		pth[n].nt.tag = n;
		pth[n].nt.dir = DMA_ISSUED_BY_ADAPTER;

		ret = nettlp_init(&pth[n].nt);
		if (ret < 0) {
			pr_err("nettlp_init for tag %u failed", pth[n].nt.tag);
			perror("nettlp_init");
			return ret;
		}

		ret = pthread_create(&pth[n].tid, NULL, nettlp_cb_thread,
				     &pth[n]);
		if (ret < 0) {
			pr_err("failed to create thread for cpu %u",
			       pth[n].nt.tag);
			perror("pthread_create");
			return ret;
		}

		usleep(20);	/*XXX: to serialiez start output on threads */
	}

	/* set signal handler to stop callback threads */
	if (signal(SIGINT, sig_handler) == SIG_ERR) {
		perror("cannot set signal\n");
		return -1;
	}

	/* thread join */
	for (n = 0; n < NTHREADS; n++)
		pthread_join(pth[n].tid, NULL);

	return 0;
}